

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaParser::ReadEffectColor(ColladaParser *this,aiColor4D *pColor,Sampler *pSampler)

{
  _func_int *p_Var1;
  Sampler *pSVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *pcVar5;
  byte *pbVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  string curElem;
  allocator<char> local_81;
  Sampler *local_80;
  string *local_78;
  aiColor4D *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar3 == '\0') {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,(char *)CONCAT44(extraout_var,iVar3),&local_81);
    local_78 = &pSampler->mUVChannel;
    local_58 = &pColor->g;
    local_60 = &pColor->b;
    local_68 = &pColor->a;
    local_80 = pSampler;
    local_70 = pColor;
LAB_00426b91:
    do {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar3 == '\0') break;
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      p_Var1 = this->mReader->_vptr_IIrrXMLReader[3];
      if (iVar3 == 1) {
        iVar3 = (*p_Var1)();
        if (iVar3 == 1) {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"color");
          if (iVar3 == 0) {
            pcVar5 = GetTextContent(this);
            pbVar6 = (byte *)fast_atoreal_move<float>(pcVar5,&pColor->r,true);
            while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0)))
            {
              pbVar6 = pbVar6 + 1;
            }
            pbVar6 = (byte *)fast_atoreal_move<float>((char *)pbVar6,local_58,true);
            while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0)))
            {
              pbVar6 = pbVar6 + 1;
            }
            pbVar6 = (byte *)fast_atoreal_move<float>((char *)pbVar6,local_60,true);
            while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0)))
            {
              pbVar6 = pbVar6 + 1;
            }
            fast_atoreal_move<float>((char *)pbVar6,local_68,true);
            TestClosing(this,"color");
            goto LAB_00426b91;
          }
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 == 1) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"texture");
            if (iVar3 == 0) {
              GetAttribute(this,"texture");
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
              pSVar2 = local_80;
              pcVar5 = (char *)(local_80->mName)._M_string_length;
              strlen((char *)CONCAT44(extraout_var_04,iVar3));
              std::__cxx11::string::_M_replace
                        ((ulong)pSVar2,0,pcVar5,CONCAT44(extraout_var_04,iVar3));
              iVar3 = TestAttribute(this,"texcoord");
              if (-1 < iVar3) {
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
                pcVar5 = (char *)(local_80->mUVChannel)._M_string_length;
                strlen((char *)CONCAT44(extraout_var_05,iVar3));
                std::__cxx11::string::_M_replace
                          ((ulong)local_78,0,pcVar5,CONCAT44(extraout_var_05,iVar3));
              }
              local_70->r = 1.0;
              local_70->g = 1.0;
              local_70->b = 1.0;
              local_70->a = 1.0;
              pColor = local_70;
              goto LAB_00426b91;
            }
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 == 1) {
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"technique");
              if (iVar3 == 0) {
                uVar4 = GetAttribute(this,"profile");
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
                pcVar5 = (char *)CONCAT44(extraout_var_06,iVar3);
                iVar3 = strcmp(pcVar5,"MAYA");
                if (((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"MAX3D"), iVar3 == 0)) ||
                   (iVar3 = strcmp(pcVar5,"OKINO"), iVar3 == 0)) {
                  ReadSamplerProperties(this,local_80);
                }
                else {
                  SkipElement(this);
                }
                goto LAB_00426b91;
              }
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar3 == 1) {
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"extra");
                if (iVar3 != 0) {
                  SkipElement(this);
                }
                goto LAB_00426b91;
              }
            }
          }
        }
        __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                      ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
      }
      iVar3 = (*p_Var1)();
      if (iVar3 != 2) goto LAB_00426b91;
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = std::__cxx11::string::compare((char *)local_50);
    } while (iVar3 != 0);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadEffectColor(aiColor4D& pColor, Sampler& pSampler)
{
    if (mReader->isEmptyElement())
        return;

    // Save current element name
    const std::string curElem = mReader->getNodeName();

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("color"))
            {
                // text content contains 4 floats
                const char* content = GetTextContent();

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.r);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.g);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.b);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.a);
                SkipSpacesAndLineEnd(&content);
                TestClosing("color");
            }
            else if (IsElement("texture"))
            {
                // get name of source texture/sampler
                int attrTex = GetAttribute("texture");
                pSampler.mName = mReader->getAttributeValue(attrTex);

                // get name of UV source channel. Specification demands it to be there, but some exporters
                // don't write it. It will be the default UV channel in case it's missing.
                attrTex = TestAttribute("texcoord");
                if (attrTex >= 0)
                    pSampler.mUVChannel = mReader->getAttributeValue(attrTex);
                //SkipElement();

                // as we've read texture, the color needs to be 1,1,1,1
                pColor = aiColor4D(1.f, 1.f, 1.f, 1.f);
            }
            else if (IsElement("technique"))
            {
                const int _profile = GetAttribute("profile");
                const char* profile = mReader->getAttributeValue(_profile);

                // Some extensions are quite useful ... ReadSamplerProperties processes
                // several extensions in MAYA, OKINO and MAX3D profiles.
                if (!::strcmp(profile, "MAYA") || !::strcmp(profile, "MAX3D") || !::strcmp(profile, "OKINO"))
                {
                    // get more information on this sampler
                    ReadSamplerProperties(pSampler);
                }
                else SkipElement();
            }
            else if (!IsElement("extra"))
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (mReader->getNodeName() == curElem)
                break;
        }
    }
}